

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VSubjectInfo_Marker>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VSubjectInfo_Marker,_std::allocator<ViconCGStreamDetail::VSubjectInfo_Marker>_>
          *o_rValues)

{
  uint uVar1;
  pointer puVar2;
  pointer pVVar3;
  bool bVar4;
  ulong __new_size;
  pointer this_00;
  
  std::
  vector<ViconCGStreamDetail::VSubjectInfo_Marker,_std::allocator<ViconCGStreamDetail::VSubjectInfo_Marker>_>
  ::clear(o_rValues);
  uVar1 = (this->m_BufferImpl).m_Offset;
  puVar2 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < (ulong)uVar1 + 4) {
    bVar4 = false;
  }
  else {
    __new_size = (ulong)*(uint *)(puVar2 + uVar1);
    (this->m_BufferImpl).m_Offset = uVar1 + 4;
    std::
    vector<ViconCGStreamDetail::VSubjectInfo_Marker,_std::allocator<ViconCGStreamDetail::VSubjectInfo_Marker>_>
    ::resize(o_rValues,__new_size);
    pVVar3 = (o_rValues->
             super__Vector_base<ViconCGStreamDetail::VSubjectInfo_Marker,_std::allocator<ViconCGStreamDetail::VSubjectInfo_Marker>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this_00 = (pointer)0x0;
    if (pVVar3 != (o_rValues->
                  super__Vector_base<ViconCGStreamDetail::VSubjectInfo_Marker,_std::allocator<ViconCGStreamDetail::VSubjectInfo_Marker>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = pVVar3;
    }
    if (__new_size == 0) {
      bVar4 = true;
    }
    else {
      do {
        __new_size = __new_size - 1;
        bVar4 = ViconCGStreamDetail::VSubjectInfo_Marker::Read
                          (this_00,(this->m_BufferImpl).m_rParent);
        if (!bVar4) {
          return bVar4;
        }
        this_00 = this_00 + 1;
      } while (__new_size != 0);
    }
  }
  return bVar4;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }